

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O2

fvar<double,_2UL> * __thiscall
ising::free_energy::triangular::
infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (fvar<double,_2UL> *__return_storage_ptr__,triangular *this,double Ja,double Jb,double Jc,
          fvar<double,_2UL> beta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  fvar<double,_2UL> beta_00;
  double dVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *cr_00;
  unsigned_long j;
  long lVar6;
  double dVar7;
  unsigned_long j_1;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> *this_01;
  int iVar8;
  bool bVar9;
  fvar<double,_2UL> retval_22;
  fvar<double,_2UL> retval;
  fvar<double,_2UL> local_178;
  double local_160;
  fvar<double,_2UL> retval_10;
  root_type local_138;
  int local_12c;
  fvar<double,_2UL> pz;
  result_t g_1;
  fvar<double,_2UL> local_d0;
  fvar<double,_2UL> pe;
  fvar<double,_2UL> pn;
  
  if (Ja * Jb * Jc <= 0.0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Ja * Jb * Jc should be positive");
  }
  else {
    if (0.0 < beta.v._M_elems[0]) {
      (anonymous_namespace)::
      func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                ((functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                  *)&pn,(_anonymous_namespace_ *)this,Ja,Jb,Jc,beta);
      pz.v._M_elems[0] = 0.0;
      pz.v._M_elems[1] = 0.0;
      pz.v._M_elems[2] = 0.0;
      anon_unknown_1::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&retval_22,
                 (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                  *)&pn,0.0,0.0);
      anon_unknown_1::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_178,
                 (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                  *)&pn,0.0,6.283185307179586);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (&retval_22,&local_178);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                ((fvar<double,2ul> *)&pz,&retval);
      for (iVar8 = 1; iVar8 != 0x11; iVar8 = iVar8 + 2) {
        local_178.v._M_elems[0] = 4.0;
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&retval_22,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,0.0,(double)iVar8 * 0.7853981633974483 * 0.5 + 0.0);
        retval.v._M_elems[2] = retval_22.v._M_elems[2];
        retval.v._M_elems[0] = retval_22.v._M_elems[0];
        retval.v._M_elems[1] = retval_22.v._M_elems[1];
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                  (&retval,(root_type *)&local_178);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  ((fvar<double,2ul> *)&pz,&retval);
      }
      dVar4 = 1.0;
      iVar8 = 7;
      while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
        local_178.v._M_elems[0] = 2.0;
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&retval_22,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,0.0,dVar4 * 0.7853981633974483 + 0.0);
        retval.v._M_elems[2] = retval_22.v._M_elems[2];
        retval.v._M_elems[0] = retval_22.v._M_elems[0];
        retval.v._M_elems[1] = retval_22.v._M_elems[1];
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                  (&retval,(root_type *)&local_178);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  ((fvar<double,2ul> *)&pz,&retval);
        dVar4 = dVar4 + 1.0;
      }
      dVar4 = 0.0;
      while (SUB84(dVar4,0) != 8) {
        dVar1 = (double)(SUB84(dVar4,0) * 2 + 1) * 0.7853981633974483 * 0.5 + 0.0;
        retval_10.v._M_elems[0] = 4.0;
        local_160 = dVar4;
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_178,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,dVar1,0.0);
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_d0,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,dVar1,6.283185307179586);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (&local_178,&local_d0);
        retval.v._M_elems[2] = retval_22.v._M_elems[2];
        retval.v._M_elems[0] = retval_22.v._M_elems[0];
        retval.v._M_elems[1] = retval_22.v._M_elems[1];
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                  (&retval,(root_type *)&retval_10);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  ((fvar<double,2ul> *)&pz,&retval);
        for (iVar8 = 1; iVar8 != 0x11; iVar8 = iVar8 + 2) {
          local_178.v._M_elems[0] = 16.0;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&retval_22,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,dVar1,(double)iVar8 * 0.7853981633974483 * 0.5 + 0.0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,(root_type *)&local_178);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&pz,&retval);
        }
        iVar8 = 7;
        dVar4 = 1.0;
        while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
          local_178.v._M_elems[0] = 8.0;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&retval_22,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,dVar1,dVar4 * 0.7853981633974483 + 0.0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,(root_type *)&local_178);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&pz,&retval);
          dVar4 = dVar4 + 1.0;
        }
        dVar4 = (double)(ulong)(SUB84(local_160,0) + 1);
      }
      dVar4 = 1.0;
      iVar8 = 1;
      while (iVar8 != 8) {
        dVar1 = dVar4 * 0.7853981633974483 + 0.0;
        retval_10.v._M_elems[0] = 2.0;
        local_160 = dVar4;
        local_12c = iVar8;
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_178,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,dVar1,0.0);
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_d0,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,dVar1,6.283185307179586);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (&local_178,&local_d0);
        retval.v._M_elems[2] = retval_22.v._M_elems[2];
        retval.v._M_elems[0] = retval_22.v._M_elems[0];
        retval.v._M_elems[1] = retval_22.v._M_elems[1];
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                  (&retval,(root_type *)&retval_10);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  ((fvar<double,2ul> *)&pz,&retval);
        for (iVar8 = 1; iVar8 != 0x11; iVar8 = iVar8 + 2) {
          local_178.v._M_elems[0] = 8.0;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&retval_22,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,dVar1,(double)iVar8 * 0.7853981633974483 * 0.5 + 0.0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,(root_type *)&local_178);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&pz,&retval);
        }
        iVar8 = 7;
        dVar4 = 1.0;
        while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
          local_178.v._M_elems[0] = 4.0;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&retval_22,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,dVar1,dVar4 * 0.7853981633974483 + 0.0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,(root_type *)&local_178);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&pz,&retval);
          dVar4 = dVar4 + 1.0;
        }
        dVar4 = local_160 + 1.0;
        iVar8 = local_12c + 1;
      }
      anon_unknown_1::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&retval_22,
                 (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                  *)&pn,6.283185307179586,0.0);
      anon_unknown_1::
      functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
      operator()(&local_178,
                 (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                  *)&pn,6.283185307179586,6.283185307179586);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (&retval_22,&local_178);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                ((fvar<double,2ul> *)&pz,&retval);
      for (iVar8 = 1; iVar8 != 0x11; iVar8 = iVar8 + 2) {
        local_178.v._M_elems[0] = 4.0;
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&retval_22,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,6.283185307179586,(double)iVar8 * 0.7853981633974483 * 0.5 + 0.0);
        retval.v._M_elems[2] = retval_22.v._M_elems[2];
        retval.v._M_elems[0] = retval_22.v._M_elems[0];
        retval.v._M_elems[1] = retval_22.v._M_elems[1];
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                  (&retval,(root_type *)&local_178);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  ((fvar<double,2ul> *)&pz,&retval);
      }
      dVar4 = 1.0;
      iVar8 = 7;
      while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
        local_178.v._M_elems[0] = 2.0;
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&retval_22,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,6.283185307179586,dVar4 * 0.7853981633974483 + 0.0);
        retval.v._M_elems[2] = retval_22.v._M_elems[2];
        retval.v._M_elems[0] = retval_22.v._M_elems[0];
        retval.v._M_elems[1] = retval_22.v._M_elems[1];
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                  (&retval,(root_type *)&local_178);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  ((fvar<double,2ul> *)&pz,&retval);
        dVar4 = dVar4 + 1.0;
      }
      retval.v._M_elems[0] = 0.01713472986300236;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&pz,(root_type *)&retval);
      retval_10.v._M_elems[1] = pz.v._M_elems[1];
      retval_10.v._M_elems[2] = pz.v._M_elems[2];
      retval_10.v._M_elems[0] = pz.v._M_elems[0] + 0.6931471805599453;
      pz.v._M_elems[0] = retval_10.v._M_elems[0];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
                (&retval_22,(fvar<double,2ul> *)&beta,&beta);
      local_178.v._M_elems[0] =
           boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                     (&retval_10,2);
      retval.v._M_elems[0] = retval_22.v._M_elems[0];
      retval.v._M_elems[1] = retval_22.v._M_elems[1];
      retval.v._M_elems[2] = retval_22.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval,(root_type *)&local_178);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
                ((promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)&pn,(fvar<double,2ul> *)&retval,
                 &retval_10);
      this_01 = (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                 *)&pn;
      boost::math::differentiation::autodiff_v1::detail::fabs<double,2ul>(&pe,(detail *)&pn,cr);
      dVar4 = 7.90505033345994e-323;
      while ((ulong)dVar4 < 0x10001) {
        beta_00.v._M_elems[1] = beta.v._M_elems[1];
        beta_00.v._M_elems[0] = beta.v._M_elems[0];
        beta_00.v._M_elems[2] = beta.v._M_elems[2];
        (anonymous_namespace)::
        func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                  ((functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,(_anonymous_namespace_ *)this_01,Ja,Jb,Jc,beta_00);
        dVar3 = 6.283185307179586 / (double)(long)dVar4;
        g_1.v._M_elems[0] = 0.0;
        g_1.v._M_elems[1] = 0.0;
        g_1.v._M_elems[2] = 0.0;
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&retval_22,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,0.0,0.0);
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_178,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,0.0,6.283185307179586);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (&retval_22,&local_178);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  ((fvar<double,2ul> *)&g_1,&retval);
        dVar1 = (double)((long)dVar4 * 2);
        for (lVar6 = 0; (long)dVar1 - lVar6 != 0; lVar6 = lVar6 + 2) {
          local_178.v._M_elems[0] = 4.0;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&retval_22,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,0.0,(double)(lVar6 + 1) * dVar3 * 0.5 + 0.0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,(root_type *)&local_178);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&g_1,&retval);
        }
        for (dVar7 = 4.94065645841247e-324; dVar4 != dVar7; dVar7 = (double)((long)dVar7 + 1)) {
          local_178.v._M_elems[0] = 2.0;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&retval_22,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,0.0,(double)(long)dVar7 * dVar3 + 0.0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,(root_type *)&local_178);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&g_1,&retval);
        }
        dVar7 = 0.0;
        while (dVar7 != dVar4) {
          dVar2 = (double)((long)dVar7 * 2 + 1) * dVar3 * 0.5 + 0.0;
          local_138 = 4.0;
          local_160 = dVar7;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_178,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,dVar2,0.0);
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_d0,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,dVar2,6.283185307179586);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                    (&local_178,&local_d0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,&local_138);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&g_1,&retval);
          for (lVar6 = 0; (long)dVar1 - lVar6 != 0; lVar6 = lVar6 + 2) {
            local_178.v._M_elems[0] = 16.0;
            anon_unknown_1::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&retval_22,
                       (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                        *)&pn,dVar2,(double)(lVar6 + 1) * dVar3 * 0.5 + 0.0);
            retval.v._M_elems[2] = retval_22.v._M_elems[2];
            retval.v._M_elems[0] = retval_22.v._M_elems[0];
            retval.v._M_elems[1] = retval_22.v._M_elems[1];
            boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                      (&retval,(root_type *)&local_178);
            boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                      ((fvar<double,2ul> *)&g_1,&retval);
          }
          for (dVar7 = 4.94065645841247e-324; dVar4 != dVar7; dVar7 = (double)((long)dVar7 + 1)) {
            local_178.v._M_elems[0] = 8.0;
            anon_unknown_1::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&retval_22,
                       (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                        *)&pn,dVar2,(double)(long)dVar7 * dVar3 + 0.0);
            retval.v._M_elems[2] = retval_22.v._M_elems[2];
            retval.v._M_elems[0] = retval_22.v._M_elems[0];
            retval.v._M_elems[1] = retval_22.v._M_elems[1];
            boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                      (&retval,(root_type *)&local_178);
            boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                      ((fvar<double,2ul> *)&g_1,&retval);
          }
          dVar7 = (double)((long)local_160 + 1);
        }
        dVar7 = 4.94065645841247e-324;
        while (dVar7 != dVar4) {
          dVar2 = (double)(long)dVar7 * dVar3 + 0.0;
          local_138 = 2.0;
          local_160 = dVar7;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_178,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,dVar2,0.0);
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&local_d0,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,dVar2,6.283185307179586);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                    (&local_178,&local_d0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,&local_138);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&g_1,&retval);
          for (lVar6 = 0; (long)dVar1 - lVar6 != 0; lVar6 = lVar6 + 2) {
            local_178.v._M_elems[0] = 8.0;
            anon_unknown_1::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&retval_22,
                       (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                        *)&pn,dVar2,(double)(lVar6 + 1) * dVar3 * 0.5 + 0.0);
            retval.v._M_elems[2] = retval_22.v._M_elems[2];
            retval.v._M_elems[0] = retval_22.v._M_elems[0];
            retval.v._M_elems[1] = retval_22.v._M_elems[1];
            boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                      (&retval,(root_type *)&local_178);
            boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                      ((fvar<double,2ul> *)&g_1,&retval);
          }
          for (dVar7 = 4.94065645841247e-324; dVar4 != dVar7; dVar7 = (double)((long)dVar7 + 1)) {
            local_178.v._M_elems[0] = 4.0;
            anon_unknown_1::
            functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
            operator()(&retval_22,
                       (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                        *)&pn,dVar2,(double)(long)dVar7 * dVar3 + 0.0);
            retval.v._M_elems[2] = retval_22.v._M_elems[2];
            retval.v._M_elems[0] = retval_22.v._M_elems[0];
            retval.v._M_elems[1] = retval_22.v._M_elems[1];
            boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                      (&retval,(root_type *)&local_178);
            boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                      ((fvar<double,2ul> *)&g_1,&retval);
          }
          dVar7 = (double)((long)local_160 + 1);
        }
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&retval_22,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,6.283185307179586,0.0);
        anon_unknown_1::
        functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
        operator()(&local_178,
                   (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                    *)&pn,6.283185307179586,6.283185307179586);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                  (&retval_22,&local_178);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                  ((fvar<double,2ul> *)&g_1,&retval);
        for (lVar6 = 0; (long)dVar1 - lVar6 != 0; lVar6 = lVar6 + 2) {
          local_178.v._M_elems[0] = 4.0;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&retval_22,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,6.283185307179586,(double)(lVar6 + 1) * dVar3 * 0.5 + 0.0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,(root_type *)&local_178);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&g_1,&retval);
        }
        for (dVar7 = 4.94065645841247e-324; dVar4 != dVar7; dVar7 = (double)((long)dVar7 + 1)) {
          local_178.v._M_elems[0] = 2.0;
          anon_unknown_1::
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::
          operator()(&retval_22,
                     (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                      *)&pn,6.283185307179586,(double)(long)dVar7 * dVar3 + 0.0);
          retval.v._M_elems[2] = retval_22.v._M_elems[2];
          retval.v._M_elems[0] = retval_22.v._M_elems[0];
          retval.v._M_elems[1] = retval_22.v._M_elems[1];
          boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                    (&retval,(root_type *)&local_178);
          boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                    ((fvar<double,2ul> *)&g_1,&retval);
        }
        retval.v._M_elems[0] = (dVar3 * dVar3) / 36.0;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                  ((fvar<double,_2UL> *)&g_1,(root_type *)&retval);
        retval_10.v._M_elems[1] = g_1.v._M_elems[1];
        retval_10.v._M_elems[2] = g_1.v._M_elems[2];
        retval_10.v._M_elems[0] = g_1.v._M_elems[0] + 0.6931471805599453;
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
                  (&local_178,(fvar<double,2ul> *)&beta,&beta);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                  (&retval_10,&pz);
        g_1.v._M_elems[0] =
             boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                       (&local_d0,2);
        retval_22.v._M_elems[0] = local_178.v._M_elems[0];
        retval_22.v._M_elems[1] = local_178.v._M_elems[1];
        retval_22.v._M_elems[2] = local_178.v._M_elems[2];
        boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                  (&retval_22,(root_type *)&g_1);
        boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
                  ((promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)&retval,
                   (fvar<double,2ul> *)&retval_22,&retval_10);
        this_01 = (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                   *)&retval;
        boost::math::differentiation::autodiff_v1::detail::fabs<double,2ul>
                  (&pn,(detail *)&retval,cr_00);
        if ((pn.v._M_elems[0] < 4.440892098500626e-16) || (pe.v._M_elems[0] < pn.v._M_elems[0]))
        break;
        if (dVar4 == 3.23790861658519e-319) {
          poVar5 = std::operator<<((ostream *)&std::cerr,
                                   "Warning: integration not converge with n = ");
          this_01 = (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                     *)0x10000;
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        pz.v._M_elems[2] = retval_10.v._M_elems[2];
        pz.v._M_elems[0] = retval_10.v._M_elems[0];
        pz.v._M_elems[1] = retval_10.v._M_elems[1];
        pe.v._M_elems[0] = pn.v._M_elems[0];
        dVar4 = dVar1;
      }
      pn.v._M_elems[2] = retval_10.v._M_elems[2];
      pn.v._M_elems[0] = retval_10.v._M_elems[0];
      pn.v._M_elems[1] = retval_10.v._M_elems[1];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::negate(&pn);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
                (__return_storage_ptr__,(fvar<double,2ul> *)&pn,&beta);
      return __return_storage_ptr__;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"beta should be positive");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Ja, T Jb, T Jc, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Ja * Jb * Jc <= 0)
    throw(std::invalid_argument("Ja * Jb * Jc should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  auto logZ =
      log(real_t(2)) + standards::simpson_2d(func(Ja, Jb, Jc, beta), real_t(0),
                                             real_t(0), 2 * pi, 2 * pi, 8, 8);
  auto pz = logZ;
  auto pe = abs(beta * beta * logZ.derivative(2) / logZ);
  for (unsigned long n = 16; n <= max_n; n *= 2) {
    logZ = log(real_t(2)) + standards::simpson_2d(func(Ja, Jb, Jc, beta),
                                                  real_t(0), real_t(0), 2 * pi,
                                                  2 * pi, n, n);
    auto pn = abs(beta * beta * (logZ - pz).derivative(2) / logZ);
    if (pn < 2 * std::numeric_limits<real_t>::epsilon() || pn > pe)
      break;
    if (n == max_n)
      std::cerr << "Warning: integration not converge with n = " << max_n
                << std::endl;
    pz = logZ;
    pe = pn;
  }
  return -logZ / beta;
}